

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_14f7919::QChildProcess::startProcess(QChildProcess *this)

{
  uint uVar1;
  UnixProcessFlags UVar2;
  _Head_base<0UL,_QProcessPrivate::UnixExtras_*,_false> _Var3;
  _Head_base<0UL,_char_**,_false> __argv;
  _Head_base<0UL,_char_**,_false> __envp;
  int iVar4;
  int iVar5;
  __pid_t _Var6;
  __gid_t __gid;
  __uid_t __uid;
  int iVar7;
  int *piVar8;
  QProcessPrivate *pQVar9;
  byte bVar10;
  int sig;
  char *pcVar11;
  undefined4 uVar12;
  bool bVar13;
  sigset_t set;
  _union_1457 local_158;
  undefined1 *puStack_150;
  sigset_t local_b8;
  
  QProcessPrivate::commitChannels(this->d);
  iVar5 = this->d->childStartedPipe[0];
  do {
    iVar4 = close(iVar5);
    if (iVar4 != -1) break;
    piVar8 = __errno_location();
  } while (*piVar8 == 4);
  if ((-1 < this->workingDirectory) && (iVar5 = fchdir(this->workingDirectory), iVar5 == -1)) {
    pQVar9 = this->d;
    piVar8 = __errno_location();
    iVar5 = *piVar8;
    pcVar11 = "fchdir";
    goto LAB_00433d97;
  }
  _Var3._M_head_impl =
       (this->d->unixExtras)._M_t.
       super___uniq_ptr_impl<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
       ._M_t.
       super__Tuple_impl<0UL,_QProcessPrivate::UnixExtras_*,_std::default_delete<QProcessPrivate::UnixExtras>_>
       .super__Head_base<0UL,_QProcessPrivate::UnixExtras_*,_false>._M_head_impl;
  if ((_Any_data *)_Var3._M_head_impl == (_Any_data *)0x0) {
    bVar10 = 0;
    bVar13 = false;
  }
  else {
    if (*(long *)&((_Var3._M_head_impl)->childProcessModifier).super__Function_base._M_manager != 0)
    {
      (*((_Var3._M_head_impl)->childProcessModifier)._M_invoker)((_Any_data *)_Var3._M_head_impl);
    }
    _Var3._M_head_impl =
         (this->d->unixExtras)._M_t.
         super___uniq_ptr_impl<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
         ._M_t.
         super__Tuple_impl<0UL,_QProcessPrivate::UnixExtras_*,_std::default_delete<QProcessPrivate::UnixExtras>_>
         .super__Head_base<0UL,_QProcessPrivate::UnixExtras_*,_false>._M_head_impl;
    uVar1 = *(uint *)&((_Var3._M_head_impl)->processParameters).flags;
    if ((uVar1 & 2) != 0) {
      memset(&local_158,0xaa,0x98);
      memset(&local_158,0,0x98);
      local_158 = (_union_1457)0x1;
      sigaction(0xd,(sigaction *)&local_158,(sigaction *)0x0);
    }
    if ((*(byte *)&((_Var3._M_head_impl)->processParameters).flags & 1) != 0) {
      memset(&local_158,0,0x98);
      iVar5 = 1;
      do {
        if (((byte)uVar1 >> 1 & iVar5 == 0xd) == 0) {
          sigaction(iVar5,(sigaction *)&local_158,(sigaction *)0x0);
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 != 0x41);
      local_b8.__val[0xe] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[0xf] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[0xc] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[0xd] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[10] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[0xb] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[8] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[9] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[6] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[7] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[4] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[5] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[2] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[3] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[0] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[1] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      sigemptyset(&local_b8);
      sigprocmask(2,&local_b8,(sigset_t *)0x0);
    }
    if ((*(byte *)&((_Var3._M_head_impl)->processParameters).flags & 0x10) != 0) {
      iVar5 = ((_Var3._M_head_impl)->processParameters).lowestFileDescriptorToClose;
      iVar4 = 3;
      if (3 < iVar5) {
        iVar4 = iVar5;
      }
      iVar5 = close_range(iVar4,0x7fffffff,4);
      if (iVar5 == -1) {
        local_158.sa_handler = (__sighandler_t)&DAT_aaaaaaaaaaaaaaaa;
        puStack_150 = &DAT_aaaaaaaaaaaaaaaa;
        iVar5 = getrlimit(RLIMIT_NOFILE,(rlimit *)&local_158);
        uVar12 = 0x7fffffff;
        if (iVar5 == 0) {
          uVar12 = local_158._0_4_;
        }
        if (iVar4 < (int)uVar12) {
          do {
            fcntl(iVar4,2,1);
            iVar4 = iVar4 + 1;
          } while (uVar12 != iVar4);
        }
      }
    }
    if (((*(byte *)&((_Var3._M_head_impl)->processParameters).flags & 0x40) == 0) ||
       (_Var6 = setsid(), -1 < _Var6)) {
      if (((*(byte *)&((_Var3._M_head_impl)->processParameters).flags & 0x80) != 0) &&
         (iVar5 = ::open("/dev/tty",0x100), -1 < iVar5)) {
        iVar7 = ioctl(iVar5,0x5422);
        piVar8 = __errno_location();
        iVar4 = *piVar8;
        close(iVar5);
        if (iVar7 != 0) {
          *piVar8 = iVar4;
          pcVar11 = "ioctl";
          goto LAB_00433c53;
        }
      }
      if ((((_Var3._M_head_impl)->processParameters).flags.
           super_QFlagsStorageHelper<QProcess::UnixProcessFlag,_4>.
           super_QFlagsStorage<QProcess::UnixProcessFlag>.i & 0x200) != 0) {
        local_158.sa_handler = (__sighandler_t)&DAT_aaaaaaaaaaaaaaaa;
        puStack_150 = &DAT_aaaaaaaaaaaaaaaa;
        iVar5 = getrlimit(RLIMIT_CORE,(rlimit *)&local_158);
        if ((iVar5 == 0) && (local_158.sa_handler != (__sighandler_t)0x0)) {
          local_158.sa_handler = (__sighandler_t)0x0;
          setrlimit(RLIMIT_CORE,(rlimit *)&local_158);
        }
      }
      bVar13 = true;
      if ((((_Var3._M_head_impl)->processParameters).flags.
           super_QFlagsStorageHelper<QProcess::UnixProcessFlag,_4>.
           super_QFlagsStorage<QProcess::UnixProcessFlag>.i & 0x100) != 0) {
        __gid = getgid();
        setgid(__gid);
        __uid = getuid();
        setuid(__uid);
      }
      pcVar11 = (char *)0x0;
    }
    else {
      pcVar11 = "setsid";
LAB_00433c53:
      bVar13 = false;
    }
    pQVar9 = this->d;
    if (!bVar13) {
      piVar8 = __errno_location();
      failChildProcess(pQVar9,pcVar11,*piVar8);
    }
    UVar2.super_QFlagsStorageHelper<QProcess::UnixProcessFlag,_4>.
    super_QFlagsStorage<QProcess::UnixProcessFlag>.i =
         (((pQVar9->unixExtras)._M_t.
           super___uniq_ptr_impl<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
           ._M_t.
           super__Tuple_impl<0UL,_QProcessPrivate::UnixExtras_*,_std::default_delete<QProcessPrivate::UnixExtras>_>
           .super__Head_base<0UL,_QProcessPrivate::UnixExtras_*,_false>._M_head_impl)->
         processParameters).flags.super_QFlagsStorageHelper<QProcess::UnixProcessFlag,_4>;
    bVar13 = ((uint)UVar2.super_QFlagsStorageHelper<QProcess::UnixProcessFlag,_4>.
                    super_QFlagsStorage<QProcess::UnixProcessFlag>.i & 3) != 0;
    bVar10 = (byte)UVar2.super_QFlagsStorageHelper<QProcess::UnixProcessFlag,_4>.
                   super_QFlagsStorage<QProcess::UnixProcessFlag>.i & 1;
  }
  if (!bVar13) {
    memset(&local_158,0xaa,0x98);
    memset(&local_158,0,0x98);
    sigaction(0xd,(sigaction *)&local_158,(sigaction *)0x0);
  }
  if ((bVar10 == 0) && (this->isUsingVfork == true)) {
    pthread_sigmask(2,(__sigset_t *)&this->oldsigset,(__sigset_t *)0x0);
  }
  __argv._M_head_impl =
       (this->argv).pointers._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>._M_t
       .super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
       super__Head_base<0UL,_char_**,_false>._M_head_impl;
  __envp._M_head_impl =
       (this->envp).pointers._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>._M_t
       .super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
       super__Head_base<0UL,_char_**,_false>._M_head_impl;
  pcVar11 = *__argv._M_head_impl;
  if (__envp._M_head_impl == (char **)0x0) {
    do {
      iVar5 = execv(pcVar11,__argv._M_head_impl);
      if (iVar5 != -1) break;
      piVar8 = __errno_location();
    } while (*piVar8 == 4);
  }
  else {
    do {
      iVar5 = execve(pcVar11,__argv._M_head_impl,__envp._M_head_impl);
      if (iVar5 != -1) break;
      piVar8 = __errno_location();
    } while (*piVar8 == 4);
  }
  pQVar9 = this->d;
  piVar8 = __errno_location();
  iVar5 = *piVar8;
  pcVar11 = "execve";
LAB_00433d97:
  failChildProcess(pQVar9,pcVar11,iVar5);
}

Assistant:

void QChildProcess::startProcess() const noexcept
{
    // Render channels configuration.
    d->commitChannels();

    // make sure this fd is closed if execv() succeeds
    qt_safe_close(d->childStartedPipe[0]);

    // enter the working directory
    if (workingDirectory >= 0 && fchdir(workingDirectory) == -1)
        failChildProcess(d, "fchdir", errno);

    bool sigpipeHandled = false;
    bool sigmaskHandled = false;
    if (d->unixExtras) {
        // FIRST we call the user modifier function, before we dropping
        // privileges or closing non-standard file descriptors
        callChildProcessModifier(d);

        // then we apply our other user-provided parameters
        if (const char *what = applyProcessParameters(d->unixExtras->processParameters))
            failChildProcess(d, what, errno);

        auto flags = d->unixExtras->processParameters.flags;
        using P = QProcess::UnixProcessFlag;
        sigpipeHandled = flags.testAnyFlags(P::ResetSignalHandlers | P::IgnoreSigPipe);
        sigmaskHandled = flags.testFlag(P::ResetSignalHandlers);
    }
    if (!sigpipeHandled) {
        // reset the signal that we ignored
        QtVforkSafe::change_sigpipe(SIG_DFL);       // reset the signal that we ignored
    }
    if (!sigmaskHandled) {
        // restore the signal mask from the parent, if applyProcessParameters()
        // hasn't completely reset it
        restoreSignalMask();
    }

    // execute the process
    if (!envp.pointers)
        qt_safe_execv(argv[0], argv);
    else
        qt_safe_execve(argv[0], argv, envp);
    failChildProcess(d, "execve", errno);
}